

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  char *pcVar2;
  ostream *poVar3;
  Colour *this_00;
  Colour colour_1;
  Colour colour;
  Colour local_c1;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  char local_b0 [8];
  char local_a8 [16];
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  char local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  sVar1 = (totals->assertions).failed;
  if ((totals->assertions).passed + sVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->super_StreamingReporterBase).stream,"No tests ran",0xc);
    return;
  }
  if (sVar1 == 0) {
    Colour::Colour(&local_c1,BrightGreen);
    poVar3 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"All tests passed (",0x12);
    pcVar2 = (char *)(totals->assertions).passed;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"assertion","");
    local_c0 = (undefined1  [8])pcVar2;
    local_b8._M_p = local_a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_50,local_50 + local_48);
    poVar3 = operator<<(poVar3,(pluralise *)local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
    sVar1 = (totals->testCases).passed;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"test case","");
    local_98 = (undefined1  [8])sVar1;
    local_90._M_p = local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
    poVar3 = operator<<(poVar3,(pluralise *)local_98);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    if (local_90._M_p != local_80) {
      operator_delete(local_90._M_p);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_b8._M_p != local_a8) {
      operator_delete(local_b8._M_p);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    this_00 = &local_c1;
  }
  else {
    Colour::Colour((Colour *)local_98,BrightRed);
    local_c0 = (undefined1  [8])local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"test case","");
    printCounts(this,(string *)local_c0,&totals->testCases);
    if (local_c0 != (undefined1  [8])local_b0) {
      operator_delete((void *)local_c0);
    }
    if ((totals->testCases).failed != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_StreamingReporterBase).stream," (",2);
      local_c0 = (undefined1  [8])local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"assertion","");
      printCounts(this,(string *)local_c0,&totals->assertions);
      if (local_c0 != (undefined1  [8])local_b0) {
        operator_delete((void *)local_c0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->super_StreamingReporterBase).stream,")",1);
    }
    this_00 = (Colour *)local_98;
  }
  Colour::~Colour(this_00);
  return;
}

Assistant:

void printTotals( const Totals& totals ) {
            if( totals.assertions.total() == 0 ) {
                stream << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                printCounts( "test case", totals.testCases );
                if( totals.testCases.failed > 0 ) {
                    stream << " (";
                    printCounts( "assertion", totals.assertions );
                    stream << ")";
                }
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream << "All tests passed ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }